

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O1

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,PreOrPostIncOrDec *p)

{
  FunctionBuilder *this_00;
  Context *args;
  bool bVar1;
  undefined4 uVar2;
  Variable *pVVar3;
  Allocator *this_01;
  int iVar4;
  Variable *source;
  undefined4 extraout_var;
  Variable *dest;
  Constant *args_2;
  Variable *source_00;
  Type type;
  Type local_f8;
  Type local_e0;
  Variable *local_c8;
  CodeLocation local_c0;
  Value local_b0;
  Value local_70;
  undefined4 *puVar5;
  
  pVVar3 = (this->currentTargetVariable).object;
  bVar1 = p->isIncrement;
  source = (Variable *)getAsReference(this,(p->target).object,false);
  iVar4 = (*(source->super_Expression).super_Object._vptr_Object[2])(source);
  puVar5 = (undefined4 *)CONCAT44(extraout_var,iVar4);
  uVar2 = *puVar5;
  local_f8.primitiveType.type = puVar5[1];
  local_f8._8_8_ = *(undefined8 *)(puVar5 + 2);
  local_f8.structure.object = *(Structure **)(puVar5 + 4);
  if (local_f8.structure.object != (Structure *)0x0) {
    ((local_f8.structure.object)->super_RefCountedObject).refCount =
         ((local_f8.structure.object)->super_RefCountedObject).refCount + 1;
  }
  this_00 = &this->builder;
  local_f8.isConstant = SUB41((uint)uVar2 >> 0x18,0);
  local_f8._0_2_ = SUB42(uVar2,0);
  local_f8.isRef = false;
  uVar2 = local_f8._0_4_;
  local_e0.category = local_f8.category;
  local_e0.arrayElementCategory = local_f8.arrayElementCategory;
  local_e0.isRef = false;
  local_e0.isConstant = local_f8.isConstant;
  if (local_f8.structure.object != (Structure *)0x0) {
    ((local_f8.structure.object)->super_RefCountedObject).refCount =
         ((local_f8.structure.object)->super_RefCountedObject).refCount + 1;
  }
  local_f8._0_4_ = uVar2;
  local_e0.primitiveType.type = local_f8.primitiveType.type;
  local_e0._8_8_ = local_f8._8_8_;
  local_e0.structure.object = local_f8.structure.object;
  dest = BlockBuilder::createRegisterVariable(&this_00->super_BlockBuilder,&local_e0);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_e0.structure.object);
  BlockBuilder::addAssignment
            (&this_00->super_BlockBuilder,&dest->super_Expression,(Expression *)source);
  this_01 = this->module->allocator;
  soul::Value::Value(&local_70,1);
  local_c8 = pVVar3;
  soul::Value::castToTypeExpectingSuccess(&local_b0,&local_70,&local_f8);
  args = &(p->super_Expression).super_Statement.super_ASTObject.context;
  args_2 = PoolAllocator::allocate<soul::heart::Constant,soul::CodeLocation&,soul::Value>
                     (&this_01->pool,&args->location,&local_b0);
  soul::Value::~Value(&local_b0);
  soul::Value::~Value(&local_70);
  local_c0.sourceCode.object = (args->location).sourceCode.object;
  if (local_c0.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_c0.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_c0.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_c0.location.data =
       (p->super_Expression).super_Statement.super_ASTObject.context.location.location.data;
  local_b0.type._0_4_ = bVar1 ^ 1;
  source_00 = (Variable *)
              PoolAllocator::
              allocate<soul::heart::BinaryOperator,soul::CodeLocation,soul::heart::Expression&,soul::heart::Expression&,soul::BinaryOp::Op&>
                        (&((this->builder).super_BlockBuilder.module)->allocator->pool,&local_c0,
                         &dest->super_Expression,&args_2->super_Expression,(Op *)&local_b0);
  pVVar3 = local_c8;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_c0.sourceCode.object);
  if (pVVar3 != (Variable *)0x0) {
    if (p->isPost == true) {
      BlockBuilder::addAssignment
                (&this_00->super_BlockBuilder,(Expression *)source,(Expression *)source_00);
      source_00 = dest;
      source = pVVar3;
    }
    else {
      BlockBuilder::addAssignment
                (&this_00->super_BlockBuilder,&pVVar3->super_Expression,(Expression *)source_00);
      source_00 = pVVar3;
    }
  }
  BlockBuilder::addAssignment
            (&this_00->super_BlockBuilder,&source->super_Expression,&source_00->super_Expression);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_f8.structure.object);
  return;
}

Assistant:

void visit (AST::PreOrPostIncOrDec& p) override
    {
        auto resultDestVar = currentTargetVariable;
        auto op = p.isIncrement ? BinaryOp::Op::add
                                : BinaryOp::Op::subtract;

        auto& dest = getAsReference (p.target, false);
        auto type = dest.getType().removeReferenceIfPresent();

        auto& oldValue = builder.createRegisterVariable (type);
        builder.addAssignment (oldValue, dest);
        auto& one = module.allocator.allocate<heart::Constant> (p.context.location, Value::createInt32 (1).castToTypeExpectingSuccess (type));
        auto& incrementedValue = builder.createBinaryOp (p.context.location, oldValue, one, op);

        if (resultDestVar == nullptr)
        {
            builder.addAssignment (dest, incrementedValue);
        }
        else if (p.isPost)
        {
            builder.addAssignment (dest, incrementedValue);
            builder.addAssignment (*resultDestVar, oldValue);
        }
        else
        {
            builder.addAssignment (*resultDestVar, incrementedValue);
            builder.addAssignment (dest, *resultDestVar);
        }
    }